

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::Locale::getDisplayScript(Locale *this,Locale *displayLocale,UnicodeString *result)

{
  int32_t iVar1;
  char16_t *pcVar2;
  int32_t iVar3;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  UErrorCode errorCode;
  
  errorCode = U_ZERO_ERROR;
  pcVar2 = UnicodeString::getBuffer(result,0x9d);
  __length = extraout_RDX;
  if (pcVar2 != (char16_t *)0x0) {
    if (((result->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      iVar3 = (result->fUnion).fFields.fCapacity;
    }
    else {
      iVar3 = 0x1b;
    }
    iVar1 = uloc_getDisplayScript_63(this->fullName,displayLocale->fullName,pcVar2,iVar3,&errorCode)
    ;
    iVar3 = 0;
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar3 = iVar1;
    }
    UnicodeString::releaseBuffer(result,iVar3);
    if (errorCode != U_BUFFER_OVERFLOW_ERROR) {
      return result;
    }
    pcVar2 = UnicodeString::getBuffer(result,iVar1);
    __length = extraout_RDX_00;
    if (pcVar2 != (char16_t *)0x0) {
      errorCode = U_ZERO_ERROR;
      if (((result->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        iVar3 = (result->fUnion).fFields.fCapacity;
      }
      else {
        iVar3 = 0x1b;
      }
      iVar1 = uloc_getDisplayScript_63
                        (this->fullName,displayLocale->fullName,pcVar2,iVar3,&errorCode);
      iVar3 = 0;
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar3 = iVar1;
      }
      UnicodeString::releaseBuffer(result,iVar3);
      return result;
    }
  }
  UnicodeString::truncate(result,(char *)0x0,__length);
  return result;
}

Assistant:

UnicodeString&
Locale::getDisplayScript(const Locale &displayLocale,
                          UnicodeString &result) const {
    UChar *buffer;
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t length;

    buffer=result.getBuffer(ULOC_FULLNAME_CAPACITY);
    if(buffer==0) {
        result.truncate(0);
        return result;
    }

    length=uloc_getDisplayScript(fullName, displayLocale.fullName,
                                  buffer, result.getCapacity(),
                                  &errorCode);
    result.releaseBuffer(U_SUCCESS(errorCode) ? length : 0);

    if(errorCode==U_BUFFER_OVERFLOW_ERROR) {
        buffer=result.getBuffer(length);
        if(buffer==0) {
            result.truncate(0);
            return result;
        }
        errorCode=U_ZERO_ERROR;
        length=uloc_getDisplayScript(fullName, displayLocale.fullName,
                                      buffer, result.getCapacity(),
                                      &errorCode);
        result.releaseBuffer(U_SUCCESS(errorCode) ? length : 0);
    }

    return result;
}